

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

size_t __thiscall
merlin::config_index::convert
          (config_index *this,
          map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *config)

{
  pointer pvVar1;
  pointer puVar2;
  iterator iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t i;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_t var;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&values,(long)(this->m_vars).
                           super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_vars).
                           super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 4);
  lVar9 = 0;
  uVar6 = 0;
  while( true ) {
    pvVar1 = (this->m_vars).super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->m_vars).
                  super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pvVar1 >> 4;
    if (uVar4 <= uVar6) break;
    var = *(size_t *)((long)&pvVar1->m_label + lVar9 * 2);
    iVar3 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::find(&config->_M_t,&var);
    if ((_Rb_tree_header *)iVar3._M_node != &(config->_M_t)._M_impl.super__Rb_tree_header) {
      *(_Base_ptr *)
       ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start + lVar9) = iVar3._M_node[1]._M_parent;
    }
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 8;
  }
  if ((long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == uVar4) {
    puVar2 = (this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->m_dims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (this->m_bigendian == true) {
      lVar9 = 1;
      sVar5 = 0;
      for (lVar8 = 0; (long)uVar6 >> 3 != lVar8; lVar8 = lVar8 + 1) {
        sVar5 = sVar5 + values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar8] * lVar9;
        lVar9 = lVar9 * puVar2[lVar8];
      }
    }
    else {
      uVar6 = uVar6 >> 3 & 0xffffffff;
      lVar9 = 1;
      sVar5 = 0;
      while( true ) {
        uVar6 = uVar6 - 1;
        if ((int)(uint)uVar6 < 0) break;
        uVar7 = (uint)uVar6 & 0x7fffffff;
        sVar5 = sVar5 + values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7] * lVar9;
        lVar9 = lVar9 * puVar2[uVar7];
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    return sVar5;
  }
  __assert_fail("values.size() == m_vars.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/index.h"
                ,0x255,"size_t merlin::config_index::convert(std::map<size_t, size_t> &)");
}

Assistant:

size_t convert(std::map<size_t, size_t>& config) {
		// The source variables are a subset of the config vector

		std::vector<size_t> values;
		values.resize(m_vars.size());
		for (size_t i = 0; i < m_vars.size(); ++i) {
			size_t var = m_vars[i].label();
			std::map<size_t, size_t>::iterator mi = config.find(var);
			if (mi != config.end()) {
				size_t val = mi->second;
				values[i] = val;
			}
		}

		// Safety checks
		assert(values.size() == m_vars.size());

		size_t index = 0, offset = 1;
		if (m_bigendian) { // start from the first variable
			for (size_t i = 0; i < m_dims.size(); ++i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		} else {
			for (int i = m_dims.size()-1; i >= 0; --i) {
				index += values[i]*offset;
				offset *= m_dims[i];
			}
		}

		return index;
	}